

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O0

sym_t * get_sym(char *id)

{
  int iVar1;
  char *in_RDI;
  symtbl_t *scp;
  uint i;
  symtbl_t *local_20;
  uint local_14;
  
  local_20 = scope;
  do {
    for (local_14 = 0; local_14 < local_20->num_syms; local_14 = local_14 + 1) {
      iVar1 = strcmp(local_20->syms[local_14]->id,in_RDI);
      if (iVar1 == 0) {
        return local_20->syms[local_14];
      }
    }
    local_20 = local_20->parent;
  } while (local_20 != (symtbl_t *)0x0);
  return (sym_t *)0x0;
}

Assistant:

sym_t* get_sym(const char *id)
{
    unsigned int i;
    symtbl_t* scp = scope;
    do
    {
        for (i = 0; i < scp->num_syms; i++)
        {
            if (strcmp(scp->syms[i]->id, id) == 0)
                return scp->syms[i];
        }
        scp = scp->parent;
    } while (scp != NULL);

    return NULL;
}